

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglvertexarrayobject.cpp
# Opt level: O2

int __thiscall
QOpenGLVertexArrayObjectPrivate::bind
          (QOpenGLVertexArrayObjectPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_enum_32 aVar1;
  int iVar2;
  anon_union_8_3_3501050a_for_vaoFuncs *paVar3;
  long lStack_8;
  
  aVar1 = this->vaoFuncsType;
  if (aVar1 - ARB < 3) {
    paVar3 = &this->vaoFuncs;
    lStack_8 = 0x10;
  }
  else {
    if ((aVar1 != Core_3_0) && (aVar1 != Core_3_2)) {
      return aVar1;
    }
    paVar3 = (anon_union_8_3_3501050a_for_vaoFuncs *)&((this->vaoFuncs).core_3_0)->d_3_0_Core;
    lStack_8 = 0x28;
  }
  iVar2 = (**(code **)((long)&(paVar3->core_3_0->super_QAbstractOpenGLFunctions).
                              _vptr_QAbstractOpenGLFunctions + lStack_8))(this->vao);
  return iVar2;
}

Assistant:

void QOpenGLVertexArrayObjectPrivate::bind()
{
    switch (vaoFuncsType) {
#if !QT_CONFIG(opengles2)
    case Core_3_2:
        vaoFuncs.core_3_2->glBindVertexArray(vao);
        break;
    case Core_3_0:
        vaoFuncs.core_3_0->glBindVertexArray(vao);
        break;
#endif
    case ARB:
    case APPLE:
    case OES:
        vaoFuncs.helper->glBindVertexArray(vao);
        break;
    default:
        break;
    }
}